

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::anon_unknown_1::ResolveFuncTypes(Module *module,Errors *errors)

{
  bool bVar1;
  Result RVar2;
  Index IVar3;
  reference base;
  FuncModuleField *pFVar4;
  EventModuleField *pEVar5;
  ImportModuleField *pIVar6;
  pointer pIVar7;
  FuncImport *pFVar8;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  *this;
  reference ppVar9;
  iterator rhs;
  undefined1 local_128 [8];
  ExprVisitor visitor;
  ResolveFuncTypesExprVisitorDelegate delegate;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *pair;
  iterator __end5;
  iterator __begin5;
  BindingHash *__range5;
  bool has_func_type_and_empty_signature;
  EventImport *event_import;
  FuncImport *func_import;
  ImportModuleField *import_field;
  EventModuleField *event_field;
  FuncModuleField *func_field;
  FuncDeclaration *decl;
  Func *func;
  ModuleField *field;
  iterator __end2;
  iterator __begin2;
  ModuleFieldList *__range2;
  Errors *errors_local;
  Module *module_local;
  Result result;
  
  Result::Result((Result *)((long)&module_local + 4),Ok);
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&module->fields);
  rhs = intrusive_list<wabt::ModuleField>::end(&module->fields);
  do {
    bVar1 = intrusive_list<wabt::ModuleField>::iterator::operator!=((iterator *)&__end2.node_,rhs);
    if (!bVar1) {
      return (Result)module_local._4_4_;
    }
    base = intrusive_list<wabt::ModuleField>::iterator::operator*((iterator *)&__end2.node_);
    decl = (FuncDeclaration *)0x0;
    pFVar4 = dyn_cast<wabt::FuncModuleField,wabt::ModuleField>(base);
    if (pFVar4 == (FuncModuleField *)0x0) {
      pEVar5 = dyn_cast<wabt::EventModuleField,wabt::ModuleField>(base);
      if (pEVar5 != (EventModuleField *)0x0) {
        func_field = (FuncModuleField *)&(pEVar5->event).decl;
        goto LAB_00245ed9;
      }
      pIVar6 = dyn_cast<wabt::ImportModuleField,wabt::ModuleField>(base);
      if (pIVar6 != (ImportModuleField *)0x0) {
        pIVar7 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                           (&pIVar6->import);
        pFVar8 = dyn_cast<wabt::FuncImport,wabt::Import>(pIVar7);
        if (pFVar8 == (FuncImport *)0x0) {
          pIVar7 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                             (&pIVar6->import);
          pFVar8 = (FuncImport *)dyn_cast<wabt::EventImport,wabt::Import>(pIVar7);
          if (pFVar8 == (FuncImport *)0x0) goto LAB_00246048;
        }
        func_field = (FuncModuleField *)&(pFVar8->func).decl;
        goto LAB_00245ed9;
      }
    }
    else {
      decl = (FuncDeclaration *)&pFVar4->func;
      func_field = (FuncModuleField *)&(pFVar4->func).decl;
LAB_00245ed9:
      __range5._7_1_ = false;
      if (func_field != (FuncModuleField *)0x0) {
        __range5._7_1_ = ResolveFuncTypeWithEmptySignature(module,(FuncDeclaration *)func_field);
        ResolveImplicitlyDefinedFunctionType(&base->loc,module,(FuncDeclaration *)func_field);
        RVar2 = CheckFuncTypeVarMatchesExplicit
                          (&base->loc,module,(FuncDeclaration *)func_field,errors);
        Result::operator|=((Result *)((long)&module_local + 4),RVar2);
      }
      if (decl != (FuncDeclaration *)0x0) {
        if (__range5._7_1_ != false) {
          this = (unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                  *)((long)&decl[1].type_var.field_2 + 8);
          __end5 = std::
                   unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                   ::begin(this);
          pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                  *)std::
                    unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                    ::end(this);
          while (bVar1 = std::__detail::operator!=
                                   (&__end5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
                                    ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
                                      *)&pair), bVar1) {
            ppVar9 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_false,_true>
                     ::operator*(&__end5);
            IVar3 = Func::GetNumParams((Func *)decl);
            (ppVar9->second).index = IVar3 + (ppVar9->second).index;
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_false,_true>
            ::operator++(&__end5);
          }
        }
        ResolveFuncTypesExprVisitorDelegate::ResolveFuncTypesExprVisitorDelegate
                  ((ResolveFuncTypesExprVisitorDelegate *)
                   &visitor.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,module,errors);
        ExprVisitor::ExprVisitor
                  ((ExprVisitor *)local_128,
                   (Delegate *)
                   &visitor.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        RVar2 = ExprVisitor::VisitFunc((ExprVisitor *)local_128,(Func *)decl);
        Result::operator|=((Result *)((long)&module_local + 4),RVar2);
        ExprVisitor::~ExprVisitor((ExprVisitor *)local_128);
        ResolveFuncTypesExprVisitorDelegate::~ResolveFuncTypesExprVisitorDelegate
                  ((ResolveFuncTypesExprVisitorDelegate *)
                   &visitor.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
LAB_00246048:
    intrusive_list<wabt::ModuleField>::iterator::operator++((iterator *)&__end2.node_);
  } while( true );
}

Assistant:

Result ResolveFuncTypes(Module* module, Errors* errors) {
  Result result = Result::Ok;
  for (ModuleField& field : module->fields) {
    Func* func = nullptr;
    FuncDeclaration* decl = nullptr;
    if (auto* func_field = dyn_cast<FuncModuleField>(&field)) {
      func = &func_field->func;
      decl = &func->decl;
    } else if (auto* event_field = dyn_cast<EventModuleField>(&field)) {
      decl = &event_field->event.decl;
    } else if (auto* import_field = dyn_cast<ImportModuleField>(&field)) {
      if (auto* func_import =
              dyn_cast<FuncImport>(import_field->import.get())) {
        // Only check the declaration, not the function itself, since it is an
        // import.
        decl = &func_import->func.decl;
      } else if (auto* event_import =
                     dyn_cast<EventImport>(import_field->import.get())) {
        decl = &event_import->event.decl;
      } else {
        continue;
      }
    } else {
      continue;
    }

    bool has_func_type_and_empty_signature = false;

    if (decl) {
      has_func_type_and_empty_signature =
          ResolveFuncTypeWithEmptySignature(*module, decl);
      ResolveImplicitlyDefinedFunctionType(field.loc, module, *decl);
      result |=
          CheckFuncTypeVarMatchesExplicit(field.loc, *module, *decl, errors);
    }

    if (func) {
      if (has_func_type_and_empty_signature) {
        // The call to ResolveFuncTypeWithEmptySignature may have updated the
        // function signature so there are parameters. Since parameters and
        // local variables share the same index space, we need to increment the
        // local indexes bound to a given name by the number of parameters in
        // the function.
        for (auto& pair: func->bindings) {
          pair.second.index += func->GetNumParams();
        }
      }

      ResolveFuncTypesExprVisitorDelegate delegate(module, errors);
      ExprVisitor visitor(&delegate);
      result |= visitor.VisitFunc(func);
    }
  }
  return result;
}